

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  stbi_uc *psVar2;
  stbi_uc sVar3;
  byte bVar4;
  stbi_uc sVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  stbi_uc sVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  undefined7 extraout_var;
  stbi_uc *data;
  stbi_uc *out;
  char *pcVar18;
  undefined8 extraout_RDX;
  undefined7 uVar19;
  uint y_00;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  uchar *puVar24;
  char cVar25;
  undefined4 uVar26;
  ulong uVar27;
  uint *puVar28;
  int z;
  ulong uVar29;
  uint x_00;
  long in_FS_OFFSET;
  bool bVar30;
  uchar raw_data [4];
  stbi_uc local_7c [4];
  stbi_uc *local_78;
  uint *local_70;
  undefined4 local_64;
  ulong local_60;
  uint *local_58;
  undefined4 local_50;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_70 = (uint *)x;
  local_58 = (uint *)y;
  local_4c = req_comp;
  sVar3 = stbi__get8(s);
  local_78 = (stbi_uc *)CONCAT71(local_78._1_7_,sVar3);
  sVar3 = stbi__get8(s);
  uVar27 = CONCAT71(extraout_var,sVar3) & 0xffffffff;
  bVar4 = stbi__get8(s);
  sVar3 = stbi__get8(s);
  sVar5 = stbi__get8(s);
  bVar6 = stbi__get8(s);
  bVar7 = stbi__get8(s);
  bVar8 = stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  bVar9 = stbi__get8(s);
  bVar10 = stbi__get8(s);
  sVar11 = stbi__get8(s);
  local_60 = CONCAT71(local_60._1_7_,sVar11);
  bVar12 = stbi__get8(s);
  bVar13 = stbi__get8(s);
  bVar14 = stbi__get8(s);
  local_7c[0] = '\0';
  local_7c[1] = '\0';
  local_7c[2] = '\0';
  local_7c[3] = '\0';
  cVar25 = (char)uVar27;
  uVar19 = (undefined7)((ulong)extraout_RDX >> 8);
  if (cVar25 == '\0') {
    if (bVar13 < 0x10) {
      if (bVar13 != 8) {
        if (bVar13 == 0xf) goto LAB_001387f0;
        goto LAB_00138803;
      }
LAB_001387fc:
      uVar20 = 1;
    }
    else if ((bVar13 == 0x20) || (bVar13 == 0x18)) {
      uVar20 = (uint)(bVar13 >> 3);
    }
    else {
      if (bVar13 != 0x10) goto LAB_00138803;
      uVar20 = bVar4 - 8;
      if (bVar4 < 8) {
        uVar20 = (uint)bVar4;
      }
      if (uVar20 != 3) goto LAB_001387f0;
      uVar20 = uVar20 == 3 ^ 3;
    }
LAB_00138810:
    local_64 = (undefined4)CONCAT71(uVar19,1);
    uVar26 = 0;
  }
  else {
    uVar20 = (uint)bVar8;
    if (uVar20 < 0x18) {
      if (uVar20 - 0xf < 2) {
LAB_001387f0:
        uVar20 = 3;
        uVar26 = (undefined4)CONCAT71((int7)(uVar27 >> 8),1);
        local_64 = 0;
        goto LAB_00138813;
      }
      if (uVar20 == 8) goto LAB_001387fc;
    }
    else if ((uVar20 == 0x18) || (uVar20 == 0x20)) {
      uVar20 = (uint)(bVar8 >> 3);
      goto LAB_00138810;
    }
LAB_00138803:
    local_64 = (undefined4)CONCAT71(uVar19,1);
    uVar26 = 0;
    uVar20 = 0;
  }
LAB_00138813:
  if (uVar20 == 0) {
    pcVar18 = "bad format";
    goto LAB_00138a14;
  }
  local_40 = (ulong)bVar9;
  local_38 = (ulong)bVar10 << 8;
  local_48 = local_60 & 0xff;
  x_00 = (int)local_38 + (uint)bVar9;
  y_00 = (uint)bVar12 * 0x100 + (uint)(byte)local_60;
  *local_70 = x_00;
  *local_58 = y_00;
  if (comp != (int *)0x0) {
    *comp = uVar20;
  }
  local_60 = (ulong)((uint)bVar12 * 0x100);
  iVar15 = stbi__mad3sizes_valid(x_00,y_00,uVar20,0);
  if (iVar15 == 0) {
    pcVar18 = "too large";
    goto LAB_00138a14;
  }
  data = (stbi_uc *)stbi__malloc_mad3(x_00,y_00,uVar20,0);
  if (data == (uchar *)0x0) {
LAB_00138a0d:
    pcVar18 = "outofmem";
    goto LAB_00138a14;
  }
  stbi__skip(s,(uint)(byte)local_78);
  local_50 = uVar26;
  if ((bVar4 < 8 && cVar25 == '\0') && (char)uVar26 == '\0') {
    if (y_00 != 0) {
      iVar15 = (int)local_60 + (int)local_48;
      iVar23 = 0;
      do {
        iVar15 = iVar15 + -1;
        iVar16 = iVar23;
        if ((bVar14 >> 5 & 1) == 0) {
          iVar16 = iVar15;
        }
        stbi__getn(s,data + (int)(iVar16 * uVar20 * x_00),uVar20 * x_00);
        iVar23 = iVar23 + 1;
      } while (iVar15 != 0);
    }
    goto LAB_00138c2b;
  }
  uVar21 = (uint)bVar7 * 0x100 + (uint)bVar6;
  if (cVar25 == '\0') {
    local_78 = (stbi_uc *)0x0;
    psVar2 = local_78;
  }
  else {
    if (uVar21 == 0) {
LAB_001389f7:
      free(data);
      pcVar18 = "bad palette";
LAB_00138a14:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar18;
      return (void *)0x0;
    }
    stbi__skip(s,(uint)CONCAT11(sVar5,sVar3));
    out = (stbi_uc *)stbi__malloc_mad2(uVar21,uVar20,0);
    if (out == (stbi_uc *)0x0) {
      free(data);
      goto LAB_00138a0d;
    }
    if ((char)local_64 == '\0') {
      uVar17 = (uint)CONCAT11(bVar7,bVar6);
      local_78 = out;
      do {
        stbi__tga_read_rgb16(s,out);
        out = out + uVar20;
        uVar17 = uVar17 - 1;
        psVar2 = local_78;
      } while (uVar17 != 0);
    }
    else {
      iVar15 = stbi__getn(s,out,uVar20 * uVar21);
      psVar2 = out;
      if (iVar15 == 0) {
        free(data);
        data = out;
        goto LAB_001389f7;
      }
    }
  }
  local_78 = psVar2;
  if (y_00 * x_00 != 0) {
    uVar27 = (ulong)(uVar20 + (uVar20 == 0));
    local_58 = (uint *)(ulong)(y_00 * x_00);
    puVar28 = (uint *)0x0;
    bVar6 = 0;
    local_70 = (uint *)((ulong)local_70 & 0xffffffff00000000);
    iVar15 = 0;
    do {
      if (bVar4 < 8) {
LAB_00138ac3:
        bVar30 = false;
      }
      else {
        if (iVar15 == 0) {
          bVar6 = stbi__get8(s);
          iVar15 = (bVar6 & 0x7f) + 1;
          local_70 = (uint *)CONCAT44(local_70._4_4_,(uint)(bVar6 >> 7));
          goto LAB_00138ac3;
        }
        bVar30 = (bool)(bVar6 & (int)local_70 != 0);
        local_70 = (uint *)CONCAT44(local_70._4_4_,(uint)((int)local_70 != 0));
      }
      if (!bVar30) {
        if (cVar25 == '\0') {
          if ((char)local_64 == '\0') {
            stbi__tga_read_rgb16(s,local_7c);
          }
          else {
            uVar29 = 0;
            do {
              sVar3 = stbi__get8(s);
              local_7c[uVar29] = sVar3;
              uVar29 = uVar29 + 1;
            } while (uVar27 != uVar29);
          }
        }
        else {
          bVar6 = stbi__get8(s);
          uVar17 = (uint)bVar6;
          if (bVar13 != 8) {
            sVar3 = stbi__get8(s);
            uVar17 = (uint)CONCAT11(sVar3,bVar6);
          }
          if (uVar21 <= uVar17) {
            uVar17 = 0;
          }
          memcpy(local_7c,local_78 + uVar17 * uVar20,uVar27);
        }
      }
      memcpy(data + uVar20 * (int)puVar28,local_7c,uVar27);
      iVar15 = iVar15 + -1;
      puVar28 = (uint *)((long)puVar28 + 1);
      bVar6 = 1;
    } while (puVar28 != local_58);
  }
  if (y_00 != 0 && (bVar14 >> 5 & 1) == 0) {
    uVar17 = ((int)local_60 + (int)local_48) - 1;
    iVar15 = ((uint)local_38 | (uint)local_40) * uVar20 * uVar17;
    uVar22 = 0;
    uVar21 = 0;
    do {
      if (x_00 != 0) {
        puVar24 = data;
        iVar23 = ((uint)local_38 + (uint)local_40) * uVar20 + 1;
        do {
          uVar1 = puVar24[uVar22];
          puVar24[uVar22] = puVar24[iVar15];
          puVar24[iVar15] = uVar1;
          puVar24 = puVar24 + 1;
          iVar23 = iVar23 + -1;
        } while (1 < iVar23);
      }
      iVar15 = iVar15 - uVar20 * x_00;
      uVar22 = uVar22 + uVar20 * x_00;
      bVar30 = uVar21 != uVar17 >> 1;
      uVar21 = uVar21 + 1;
    } while (bVar30);
  }
  if (local_78 != (stbi_uc *)0x0) {
    free(local_78);
  }
LAB_00138c2b:
  if (((char)local_50 == '\0' && 2 < uVar20) && (iVar15 = y_00 * x_00, iVar15 != 0)) {
    puVar24 = data + 2;
    do {
      uVar1 = puVar24[-2];
      puVar24[-2] = *puVar24;
      *puVar24 = uVar1;
      puVar24 = puVar24 + uVar20;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  if (local_4c == 0) {
    return data;
  }
  if (uVar20 == local_4c) {
    return data;
  }
  puVar24 = stbi__convert_format(data,uVar20,local_4c,x_00,y_00);
  return puVar24;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   if (tga_height > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (tga_width > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         if (tga_palette_len == 0) {  /* you have to have at least one entry! */
            STBI_FREE(tga_data);
            return stbi__errpuc("bad palette", "Corrupt TGA");
         }

         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}